

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O0

int * gsdTime(void)

{
  tm *__src;
  time_t local_48;
  time_t now;
  tm lctn;
  
  if (!gsdTime::timeSet) {
    local_48 = time((time_t *)0x0);
    __src = localtime(&local_48);
    memcpy(&now,__src,0x38);
    gsdTime::timeSet = true;
    gsdTime::timeIO[0] = lctn.tm_mday + 0x76c;
    gsdTime::timeIO[1] = lctn.tm_hour + 1;
    gsdTime::timeIO[2] = lctn.tm_min;
    gsdTime::timeIO[3] = lctn.tm_sec;
    gsdTime::timeIO[4] = now._4_4_;
    gsdTime::timeIO[5] = (int)now;
    gsdTime::timeIO[8] = lctn.tm_min;
    gsdTime::timeIO[9] = lctn.tm_sec;
    gsdTime::timeIO[10] = now._4_4_;
    gsdTime::timeIO[0xb] = (int)now;
    gsdTime::timeIO[6] = gsdTime::timeIO[0];
    gsdTime::timeIO[7] = gsdTime::timeIO[1];
  }
  return gsdTime::timeIO;
}

Assistant:

int *gsdTime()
{
  static int timeIO[12];
  static bool timeSet = false;
  tm lctn;

  if (!timeSet) {
    time_t now = time(0);
    lctn = *localtime(&now);
    timeSet = true;

    timeIO[0] = lctn.tm_year + 1900;
    timeIO[1] = lctn.tm_mon + 1;
    timeIO[2] = lctn.tm_mday;
    timeIO[3] = lctn.tm_hour;
    timeIO[4] = lctn.tm_min;
    timeIO[5] = lctn.tm_sec;
    timeIO[6] = timeIO[0];
    timeIO[7] = timeIO[1];
    timeIO[8] = timeIO[2];
    timeIO[9] = timeIO[3];
    timeIO[10] = timeIO[4];
    timeIO[11] = timeIO[5];
  }

  return timeIO;
}